

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

SPIRType * __thiscall
spirv_cross::CompilerGLSL::binary_op_bitcast_helper
          (SPIRType *__return_storage_ptr__,CompilerGLSL *this,string *cast_op0,string *cast_op1,
          BaseType *input_type,uint32_t op0,uint32_t op1,bool skip_cast_if_equal_type)

{
  BaseType BVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  bool bVar5;
  string local_50;
  
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op1);
  BVar1 = *(BaseType *)&(pSVar3->super_IVariant).field_0xc;
  bVar5 = BVar1 != *(BaseType *)&(pSVar4->super_IVariant).field_0xc;
  if (!skip_cast_if_equal_type && !bVar5) {
    bVar5 = BVar1 != *input_type;
  }
  SPIRType::SPIRType(__return_storage_ptr__);
  *(BaseType *)&(__return_storage_ptr__->super_IVariant).field_0xc = *input_type;
  __return_storage_ptr__->columns = pSVar3->columns;
  uVar2 = pSVar3->vecsize;
  __return_storage_ptr__->width = pSVar3->width;
  __return_storage_ptr__->vecsize = uVar2;
  if (bVar5) {
    bitcast_glsl_abi_cxx11_(&local_50,this,__return_storage_ptr__,op0);
    ::std::__cxx11::string::operator=((string *)cast_op0,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    bitcast_glsl_abi_cxx11_(&local_50,this,__return_storage_ptr__,op1);
    ::std::__cxx11::string::operator=((string *)cast_op1,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    to_enclosed_unpacked_expression_abi_cxx11_(&local_50,this,op0,true);
    ::std::__cxx11::string::operator=((string *)cast_op0,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    to_enclosed_unpacked_expression_abi_cxx11_(&local_50,this,op1,true);
    ::std::__cxx11::string::operator=((string *)cast_op1,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    *input_type = *(BaseType *)&(pSVar3->super_IVariant).field_0xc;
  }
  return __return_storage_ptr__;
}

Assistant:

SPIRType CompilerGLSL::binary_op_bitcast_helper(string &cast_op0, string &cast_op1, SPIRType::BaseType &input_type,
                                                uint32_t op0, uint32_t op1, bool skip_cast_if_equal_type)
{
	auto &type0 = expression_type(op0);
	auto &type1 = expression_type(op1);

	// We have to bitcast if our inputs are of different type, or if our types are not equal to expected inputs.
	// For some functions like OpIEqual and INotEqual, we don't care if inputs are of different types than expected
	// since equality test is exactly the same.
	bool cast = (type0.basetype != type1.basetype) || (!skip_cast_if_equal_type && type0.basetype != input_type);

	// Create a fake type so we can bitcast to it.
	// We only deal with regular arithmetic types here like int, uints and so on.
	SPIRType expected_type;
	expected_type.basetype = input_type;
	expected_type.vecsize = type0.vecsize;
	expected_type.columns = type0.columns;
	expected_type.width = type0.width;

	if (cast)
	{
		cast_op0 = bitcast_glsl(expected_type, op0);
		cast_op1 = bitcast_glsl(expected_type, op1);
	}
	else
	{
		// If we don't cast, our actual input type is that of the first (or second) argument.
		cast_op0 = to_enclosed_unpacked_expression(op0);
		cast_op1 = to_enclosed_unpacked_expression(op1);
		input_type = type0.basetype;
	}

	return expected_type;
}